

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cc
# Opt level: O0

void __thiscall flow::Value::Value(Value *this,Value *v)

{
  undefined8 uVar1;
  char local_118 [8];
  char buf [256];
  Value *v_local;
  Value *this_local;
  
  this->_vptr_Value = (_func_int **)&PTR__Value_002ba620;
  this->type_ = v->type_;
  buf._248_8_ = v;
  std::__cxx11::string::string((string *)&this->name_);
  (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<flow::Instr_*,_std::allocator<flow::Instr_*>_>::vector(&this->uses_);
  name_abi_cxx11_((Value *)buf._248_8_);
  uVar1 = std::__cxx11::string::c_str();
  snprintf(local_118,0x100,"%s_%llu",uVar1,valueCounter);
  valueCounter = valueCounter + 1;
  std::__cxx11::string::operator=((string *)&this->name_,local_118);
  return;
}

Assistant:

Value::Value(const Value& v) : type_(v.type_), name_(), uses_() {
  char buf[256];
  snprintf(buf, sizeof(buf), "%s_%llu", v.name().c_str(), valueCounter);
  valueCounter++;
  name_ = buf;
}